

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross_parsed_ir.cpp
# Opt level: O0

void __thiscall
spirv_cross::ParsedIR::set_decoration(ParsedIR *this,ID id,Decoration decoration,uint32_t argument)

{
  FPRoundingMode FVar1;
  mapped_type *pmVar2;
  TypedID<(spirv_cross::Types)0> local_2c;
  mapped_type *local_28;
  Decoration *dec;
  uint32_t argument_local;
  Decoration decoration_local;
  ParsedIR *this_local;
  ID id_local;
  
  dec._0_4_ = argument;
  dec._4_4_ = decoration;
  _argument_local = this;
  this_local._4_4_ = id.id;
  local_28 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&this->meta,(key_type *)((long)&this_local + 4));
  Bitset::set(&(local_28->decoration).decoration_flags,dec._4_4_);
  FVar1 = (FPRoundingMode)dec;
  if (dec._4_4_ == DecorationSpecId) {
    (local_28->decoration).spec_id = (FPRoundingMode)dec;
  }
  else if (dec._4_4_ == ArrayStride) {
    (local_28->decoration).array_stride = (FPRoundingMode)dec;
  }
  else if (dec._4_4_ == DecorationMatrixStride) {
    (local_28->decoration).matrix_stride = (FPRoundingMode)dec;
  }
  else if (dec._4_4_ == BuiltIn) {
    (local_28->decoration).builtin = true;
    (local_28->decoration).builtin_type = (FPRoundingMode)dec;
  }
  else if (dec._4_4_ == DecorationStream) {
    (local_28->decoration).stream = (FPRoundingMode)dec;
  }
  else if (dec._4_4_ == DecorationLocation) {
    (local_28->decoration).location = (FPRoundingMode)dec;
  }
  else if (dec._4_4_ == Component) {
    (local_28->decoration).component = (FPRoundingMode)dec;
  }
  else if (dec._4_4_ == DecorationIndex) {
    (local_28->decoration).index = (FPRoundingMode)dec;
  }
  else if (dec._4_4_ == Binding) {
    (local_28->decoration).binding = (FPRoundingMode)dec;
  }
  else if (dec._4_4_ == DecorationDescriptorSet) {
    (local_28->decoration).set = (FPRoundingMode)dec;
  }
  else if (dec._4_4_ == DecorationOffset) {
    (local_28->decoration).offset = (FPRoundingMode)dec;
  }
  else if (dec._4_4_ == DecorationXfbBuffer) {
    (local_28->decoration).xfb_buffer = (FPRoundingMode)dec;
  }
  else if (dec._4_4_ == DecorationXfbStride) {
    (local_28->decoration).xfb_stride = (FPRoundingMode)dec;
  }
  else if (dec._4_4_ == DecorationFPRoundingMode) {
    (local_28->decoration).fp_rounding_mode = (FPRoundingMode)dec;
  }
  else if (dec._4_4_ == DecorationInputAttachmentIndex) {
    (local_28->decoration).input_attachment = (FPRoundingMode)dec;
  }
  else if (dec._4_4_ == CounterBuffer) {
    pmVar2 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&this->meta,(key_type *)((long)&this_local + 4));
    pmVar2->hlsl_magic_counter_buffer = FVar1;
    TypedID<(spirv_cross::Types)0>::TypedID(&local_2c,(FPRoundingMode)dec);
    pmVar2 = ::std::
             unordered_map<spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta,_std::hash<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::equal_to<spirv_cross::TypedID<(spirv_cross::Types)0>_>,_std::allocator<std::pair<const_spirv_cross::TypedID<(spirv_cross::Types)0>,_spirv_cross::Meta>_>_>
             ::operator[](&this->meta,&local_2c);
    pmVar2->hlsl_is_magic_counter_buffer = true;
  }
  return;
}

Assistant:

void ParsedIR::set_decoration(ID id, Decoration decoration, uint32_t argument)
{
	auto &dec = meta[id].decoration;
	dec.decoration_flags.set(decoration);

	switch (decoration)
	{
	case DecorationBuiltIn:
		dec.builtin = true;
		dec.builtin_type = static_cast<BuiltIn>(argument);
		break;

	case DecorationLocation:
		dec.location = argument;
		break;

	case DecorationComponent:
		dec.component = argument;
		break;

	case DecorationOffset:
		dec.offset = argument;
		break;

	case DecorationXfbBuffer:
		dec.xfb_buffer = argument;
		break;

	case DecorationXfbStride:
		dec.xfb_stride = argument;
		break;

	case DecorationStream:
		dec.stream = argument;
		break;

	case DecorationArrayStride:
		dec.array_stride = argument;
		break;

	case DecorationMatrixStride:
		dec.matrix_stride = argument;
		break;

	case DecorationBinding:
		dec.binding = argument;
		break;

	case DecorationDescriptorSet:
		dec.set = argument;
		break;

	case DecorationInputAttachmentIndex:
		dec.input_attachment = argument;
		break;

	case DecorationSpecId:
		dec.spec_id = argument;
		break;

	case DecorationIndex:
		dec.index = argument;
		break;

	case DecorationHlslCounterBufferGOOGLE:
		meta[id].hlsl_magic_counter_buffer = argument;
		meta[argument].hlsl_is_magic_counter_buffer = true;
		break;

	case DecorationFPRoundingMode:
		dec.fp_rounding_mode = static_cast<FPRoundingMode>(argument);
		break;

	default:
		break;
	}
}